

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O2

void __thiscall OpenMD::SimInfo::setSnapshotManager(SimInfo *this,SnapshotManager *sman)

{
  SnapshotManager *pSVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  pointer ppRVar4;
  pointer ppCVar5;
  pointer ppBVar6;
  pointer ppBVar7;
  pointer ppTVar8;
  pointer ppIVar9;
  Atom *pAVar10;
  RigidBody *pRVar11;
  CutoffGroup *pCVar12;
  Bond *pBVar13;
  Bend *pBVar14;
  Torsion *pTVar15;
  Inversion *pIVar16;
  MoleculeIterator local_18;
  
  pSVar1 = this->sman_;
  if (pSVar1 != sman) {
    if (pSVar1 != (SnapshotManager *)0x0) {
      (*pSVar1->_vptr_SnapshotManager[1])();
    }
    this->sman_ = sman;
    local_18._M_node = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_18._M_node ==
        &(this->molecules_)._M_t._M_impl.super__Rb_tree_header) {
      pMVar2 = (Molecule *)0x0;
    }
    else {
      pMVar2 = (Molecule *)local_18._M_node[1]._M_parent;
    }
    while (pMVar2 != (Molecule *)0x0) {
      ppAVar3 = (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppAVar3 ==
          (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar10 = (Atom *)0x0;
      }
      else {
        pAVar10 = *ppAVar3;
      }
      pSVar1 = this->sman_;
      while (ppAVar3 = ppAVar3 + 1, pAVar10 != (Atom *)0x0) {
        (pAVar10->super_StuntDouble).snapshotMan_ = pSVar1;
        if (ppAVar3 ==
            (pMVar2->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pAVar10 = (Atom *)0x0;
        }
        else {
          pAVar10 = *ppAVar3;
        }
      }
      ppRVar4 = (pMVar2->rigidBodies_).
                super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppRVar4 ==
          (pMVar2->rigidBodies_).
          super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pRVar11 = (RigidBody *)0x0;
      }
      else {
        pRVar11 = *ppRVar4;
      }
      pSVar1 = this->sman_;
      while (ppRVar4 = ppRVar4 + 1, pRVar11 != (RigidBody *)0x0) {
        (pRVar11->super_StuntDouble).snapshotMan_ = pSVar1;
        if (ppRVar4 ==
            (pMVar2->rigidBodies_).
            super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pRVar11 = (RigidBody *)0x0;
        }
        else {
          pRVar11 = *ppRVar4;
        }
      }
      ppCVar5 = (pMVar2->cutoffGroups_).
                super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppCVar5 ==
          (pMVar2->cutoffGroups_).
          super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pCVar12 = (CutoffGroup *)0x0;
      }
      else {
        pCVar12 = *ppCVar5;
      }
      pSVar1 = this->sman_;
      while (ppCVar5 = ppCVar5 + 1, pCVar12 != (CutoffGroup *)0x0) {
        pCVar12->snapshotMan_ = pSVar1;
        if (ppCVar5 ==
            (pMVar2->cutoffGroups_).
            super__Vector_base<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pCVar12 = (CutoffGroup *)0x0;
        }
        else {
          pCVar12 = *ppCVar5;
        }
      }
      ppBVar6 = (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppBVar6 ==
          (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pBVar13 = (Bond *)0x0;
      }
      else {
        pBVar13 = *ppBVar6;
      }
      pSVar1 = this->sman_;
      while (ppBVar6 = ppBVar6 + 1, pBVar13 != (Bond *)0x0) {
        (pBVar13->super_ShortRangeInteraction).snapshotMan_ = pSVar1;
        if (ppBVar6 ==
            (pMVar2->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pBVar13 = (Bond *)0x0;
        }
        else {
          pBVar13 = *ppBVar6;
        }
      }
      ppBVar7 = (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppBVar7 ==
          (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pBVar14 = (Bend *)0x0;
      }
      else {
        pBVar14 = *ppBVar7;
      }
      pSVar1 = this->sman_;
      while (ppBVar7 = ppBVar7 + 1, pBVar14 != (Bend *)0x0) {
        (pBVar14->super_ShortRangeInteraction).snapshotMan_ = pSVar1;
        if (ppBVar7 ==
            (pMVar2->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pBVar14 = (Bend *)0x0;
        }
        else {
          pBVar14 = *ppBVar7;
        }
      }
      ppTVar8 = (pMVar2->torsions_).
                super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppTVar8 ==
          (pMVar2->torsions_).
          super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pTVar15 = (Torsion *)0x0;
      }
      else {
        pTVar15 = *ppTVar8;
      }
      pSVar1 = this->sman_;
      while (ppTVar8 = ppTVar8 + 1, pTVar15 != (Torsion *)0x0) {
        (pTVar15->super_ShortRangeInteraction).snapshotMan_ = pSVar1;
        if (ppTVar8 ==
            (pMVar2->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pTVar15 = (Torsion *)0x0;
        }
        else {
          pTVar15 = *ppTVar8;
        }
      }
      ppIVar9 = (pMVar2->inversions_).
                super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppIVar9 ==
          (pMVar2->inversions_).
          super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar16 = (Inversion *)0x0;
      }
      else {
        pIVar16 = *ppIVar9;
      }
      pSVar1 = this->sman_;
      while (ppIVar9 = ppIVar9 + 1, pIVar16 != (Inversion *)0x0) {
        (pIVar16->super_ShortRangeInteraction).snapshotMan_ = pSVar1;
        if (ppIVar9 ==
            (pMVar2->inversions_).
            super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          pIVar16 = (Inversion *)0x0;
        }
        else {
          pIVar16 = *ppIVar9;
        }
      }
      pMVar2 = nextMolecule(this,&local_18);
    }
  }
  return;
}

Assistant:

void SimInfo::setSnapshotManager(SnapshotManager* sman) {
    if (sman_ == sman) { return; }
    delete sman_;
    sman_ = sman;

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator rbIter;
    Molecule::CutoffGroupIterator cgIter;
    Molecule::BondIterator bondIter;
    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;

    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    CutoffGroup* cg;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        atom->setSnapshotManager(sman_);
      }
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->setSnapshotManager(sman_);
      }
      for (cg = mol->beginCutoffGroup(cgIter); cg != NULL;
           cg = mol->nextCutoffGroup(cgIter)) {
        cg->setSnapshotManager(sman_);
      }
      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bond->setSnapshotManager(sman_);
      }
      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        bend->setSnapshotManager(sman_);
      }
      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        torsion->setSnapshotManager(sman_);
      }
      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        inversion->setSnapshotManager(sman_);
      }
    }
  }